

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_state_51.cpp
# Opt level: O2

vector<lua_State_*,_std::allocator<lua_State_*>_> *
FindAllCoroutine_lua51
          (vector<lua_State_*,_std::allocator<lua_State_*>_> *__return_storage_ptr__,
          lua_State_conflict2 *L)

{
  GCObject_conflict *pGVar1;
  GCObject_conflict *local_20;
  
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lua_State_*,_std::allocator<lua_State_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pGVar1 = (GCObject_conflict *)&L->l_G->rootgc;
  while (pGVar1 = (pGVar1->gch).next, pGVar1 != (GCObject_conflict *)0x0) {
    if ((pGVar1->gch).tt == '\b') {
      local_20 = pGVar1;
      std::vector<lua_State*,std::allocator<lua_State*>>::emplace_back<lua_State*>
                ((vector<lua_State*,std::allocator<lua_State*>> *)__return_storage_ptr__,
                 (lua_State **)&local_20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<lua_State*> FindAllCoroutine_lua51(lua_State* L)
{
	std::vector<lua_State*> result;
	auto head = G(L)->rootgc;

	while (head)
	{
		if (head->gch.tt == LUA_TTHREAD)
		{
			result.push_back(reinterpret_cast<lua_State*>(head));
		}
		head = head->gch.next;
	}

	return result;
}